

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O0

void __thiscall xray_re::xr_cform::load(xr_cform *this,xr_reader *r)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t face_count;
  size_t vertex_count;
  uint32_t version;
  xr_reader *r_local;
  xr_cform *this_local;
  
  uVar1 = xr_reader::r_u32(r);
  if (uVar1 < 2 || 4 < uVar1) {
    __assert_fail("version >= CFORM_VERSION_2 && version <= CFORM_VERSION_4",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_cform.cxx"
                  ,0x2a,"void xray_re::xr_cform::load(xr_reader &)");
  }
  uVar2 = xr_reader::r_u32(r);
  uVar3 = xr_reader::r_u32(r);
  xr_reader::r_fvector3(r,(fvector3 *)&this->m_bbox);
  xr_reader::r_fvector3(r,&(this->m_bbox).field_0.field_0.max);
  xr_reader::r_seq<std::vector<xray_re::cf_vertex,std::allocator<xray_re::cf_vertex>>,read_vertex>
            (r,uVar2,&this->m_vertices);
  if ((uVar1 == 2) || (uVar1 == 3)) {
    xr_reader::r_seq<std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>,read_face_v2>
              (r,uVar3,&this->m_faces);
  }
  else if (uVar1 == 4) {
    xr_reader::r_seq<std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>,read_face_v4>
              (r,uVar3,&this->m_faces);
  }
  return;
}

Assistant:

void xr_cform::load(xr_reader& r)
{
	uint32_t version = r.r_u32();
	xr_assert(version >= CFORM_VERSION_2 && version <= CFORM_VERSION_4);
	size_t vertex_count = r.r_u32();
	size_t face_count = r.r_u32();
	r.r_fvector3(m_bbox.min);
	r.r_fvector3(m_bbox.max);
	r.r_seq(vertex_count, m_vertices, read_vertex());
	if (version == CFORM_VERSION_2 || version == CFORM_VERSION_3)
		r.r_seq(face_count, m_faces, read_face_v2());
	else if (version == CFORM_VERSION_4)
		r.r_seq(face_count, m_faces, read_face_v4());
}